

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::Encode(Underwater_Acoustic_PDU *this,KDataStream *stream)

{
  pointer pSVar1;
  pointer pAVar2;
  pointer pUVar3;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EmittingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EventID,stream);
  KDataStream::Write(stream,this->m_ui8StateUpdateIndicator);
  KDataStream::Write(stream,this->m_ui8Padding1);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16PassiveParamIndex);
  KDataStream::Write(stream,this->m_ui8PropPlantConfig);
  KDataStream::Write(stream,this->m_ui8NumShafts);
  KDataStream::Write(stream,this->m_ui8NumAPA);
  KDataStream::Write(stream,this->m_ui8NumEmitterSys);
  for (pSVar1 = (this->m_vShafts).
                super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar1 != (this->m_vShafts).
                super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
                _M_impl.super__Vector_impl_data._M_finish; pSVar1 = pSVar1 + 1) {
    (*(pSVar1->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar1,stream);
  }
  for (pAVar2 = (this->m_vAPA).
                super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar2 != (this->m_vAPA).
                super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>.
                _M_impl.super__Vector_impl_data._M_finish; pAVar2 = pAVar2 + 1) {
    (*(pAVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pAVar2,stream);
  }
  for (pUVar3 = (this->m_vUAES).
                super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pUVar3 != (this->m_vUAES).
                super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                ._M_impl.super__Vector_impl_data._M_finish; pUVar3 = pUVar3 + 1) {
    (*(pUVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pUVar3,stream);
  }
  return;
}

Assistant:

void Underwater_Acoustic_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EmittingEntityID
           << KDIS_STREAM m_EventID
           << m_ui8StateUpdateIndicator
           << m_ui8Padding1
           << m_ui16PassiveParamIndex
           << m_ui8PropPlantConfig
           << m_ui8NumShafts
           << m_ui8NumAPA
           << m_ui8NumEmitterSys;

    vector<Shaft>::const_iterator citrShafts = m_vShafts.begin();

    for( ; citrShafts != m_vShafts.end(); ++citrShafts )
    {
        stream << KDIS_STREAM *citrShafts;
    }

    vector<APA>::const_iterator citrAPA =  m_vAPA.begin();

    for( ; citrAPA != m_vAPA.end(); ++citrAPA )
    {
        stream << KDIS_STREAM *citrAPA;
    }

    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAES = m_vUAES.begin();

    for( ; citrUAES != m_vUAES.end(); ++citrUAES )
    {
        stream << KDIS_STREAM *citrUAES;
    }
}